

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

int SimulationInit(uchar isPilot,uint nThreads,unsigned_long nEvents,unsigned_long firstEvent,
                  char *userOpts,void **simContext)

{
  undefined7 in_register_00000039;
  
  return -(uint)((int)CONCAT71(in_register_00000039,isPilot) != 0);
}

Assistant:

int SimulationInit(unsigned char isPilot, unsigned int nThreads, unsigned long nEvents, unsigned long firstEvent, const char * userOpts, void ** simContext)
{
    UNUSED_PARAMETER(nThreads);
    UNUSED_PARAMETER(nEvents);
    UNUSED_PARAMETER(firstEvent);
    UNUSED_PARAMETER(userOpts);
    UNUSED_PARAMETER(simContext);

    /* Check we're running in the context we where built for */
#ifdef USE_PILOT_THREAD
    if (!isPilot)
        return -1;

    return 0;
#else
    if (isPilot)
        return -1;

    return 0;
#endif
}